

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<ParamsStream<DataStream&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
          (VectorFormatter<DefaultFormatter> *this,
          ParamsStream<DataStream_&,_TransactionSerParams> *s,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *v)

{
  long lVar1;
  pointer psVar2;
  value_type *elem;
  pointer psVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<ParamsStream<DataStream&,TransactionSerParams>>
            (s,(long)(v->
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(v->
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4);
  psVar2 = (v->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (v->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar2; psVar3 = psVar3 + 1) {
    SerializeTransaction<ParamsStream<DataStream&,TransactionSerParams>,CTransaction>
              ((psVar3->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,s
               ,s->m_params);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }